

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoopSwitch<unsigned_long,unsigned_long,duckdb::GreaterThan,false,true>
                (unsigned_long *ldata,unsigned_long *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  ulong uVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  sel_t sVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  if (false_sel != (SelectionVector *)0x0 && true_sel != (SelectionVector *)0x0) {
    iVar6 = SelectFlatLoop<unsigned_long,unsigned_long,duckdb::GreaterThan,false,true,true,true>
                      (ldata,rdata,sel,count,mask,true_sel,false_sel);
    return iVar6;
  }
  uVar1 = count + 0x3f;
  if (true_sel == (SelectionVector *)0x0) {
    if (uVar1 < 0x40) {
      lVar10 = 0;
    }
    else {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      lVar10 = 0;
      uVar12 = 0;
      uVar13 = 0;
      do {
        if (puVar2 == (unsigned_long *)0x0) {
          uVar8 = uVar13 + 0x40;
          if (count <= uVar13 + 0x40) {
            uVar8 = count;
          }
LAB_00effcdb:
          uVar7 = uVar13;
          if (uVar13 < uVar8) {
            psVar4 = sel->sel_vector;
            uVar3 = *rdata;
            psVar5 = false_sel->sel_vector;
            do {
              uVar7 = uVar13;
              if (psVar4 != (sel_t *)0x0) {
                uVar7 = (ulong)psVar4[uVar13];
              }
              uVar11 = ldata[uVar13];
              psVar5[lVar10] = (sel_t)uVar7;
              lVar10 = (lVar10 + 1) - (ulong)(uVar3 < uVar11);
              uVar13 = uVar13 + 1;
              uVar7 = uVar8;
            } while (uVar8 != uVar13);
          }
        }
        else {
          uVar3 = puVar2[uVar12];
          uVar8 = uVar13 + 0x40;
          if (count <= uVar13 + 0x40) {
            uVar8 = count;
          }
          if (uVar3 == 0xffffffffffffffff) goto LAB_00effcdb;
          uVar7 = uVar8;
          if (uVar3 == 0) {
            if (uVar13 < uVar8) {
              psVar4 = sel->sel_vector;
              psVar5 = false_sel->sel_vector;
              do {
                sVar9 = (sel_t)uVar13;
                if (psVar4 != (sel_t *)0x0) {
                  sVar9 = psVar4[uVar13];
                }
                psVar5[lVar10] = sVar9;
                lVar10 = lVar10 + 1;
                uVar13 = uVar13 + 1;
              } while (uVar8 != uVar13);
            }
          }
          else {
            uVar7 = uVar13;
            if (uVar13 < uVar8) {
              psVar4 = sel->sel_vector;
              psVar5 = false_sel->sel_vector;
              uVar11 = 0;
              do {
                if (psVar4 == (sel_t *)0x0) {
                  sVar9 = (int)uVar13 + (int)uVar11;
                }
                else {
                  sVar9 = psVar4[uVar13 + uVar11];
                }
                if ((uVar3 >> (uVar11 & 0x3f) & 1) == 0) {
                  uVar7 = 1;
                }
                else {
                  uVar7 = (ulong)(ldata[uVar13 + uVar11] <= *rdata);
                }
                psVar5[lVar10] = sVar9;
                lVar10 = lVar10 + uVar7;
                uVar11 = uVar11 + 1;
                uVar7 = uVar8;
              } while ((uVar13 - uVar8) + uVar11 != 0);
            }
          }
        }
        uVar12 = uVar12 + 1;
        uVar13 = uVar7;
      } while (uVar12 != uVar1 >> 6);
    }
    iVar6 = count - lVar10;
  }
  else if (uVar1 < 0x40) {
    iVar6 = 0;
  }
  else {
    puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar6 = 0;
    uVar12 = 0;
    uVar13 = 0;
    do {
      if (puVar2 == (unsigned_long *)0x0) {
        uVar8 = uVar13 + 0x40;
        if (count <= uVar13 + 0x40) {
          uVar8 = count;
        }
LAB_00effc0b:
        uVar7 = uVar13;
        if (uVar13 < uVar8) {
          psVar4 = sel->sel_vector;
          uVar3 = *rdata;
          psVar5 = true_sel->sel_vector;
          do {
            uVar7 = uVar13;
            if (psVar4 != (sel_t *)0x0) {
              uVar7 = (ulong)psVar4[uVar13];
            }
            uVar11 = ldata[uVar13];
            psVar5[iVar6] = (sel_t)uVar7;
            iVar6 = iVar6 + (uVar3 < uVar11);
            uVar13 = uVar13 + 1;
            uVar7 = uVar8;
          } while (uVar8 != uVar13);
        }
      }
      else {
        uVar3 = puVar2[uVar12];
        uVar8 = uVar13 + 0x40;
        if (count <= uVar13 + 0x40) {
          uVar8 = count;
        }
        uVar7 = uVar8;
        if (uVar3 != 0) {
          if (uVar3 == 0xffffffffffffffff) goto LAB_00effc0b;
          uVar7 = uVar13;
          if (uVar13 < uVar8) {
            psVar4 = sel->sel_vector;
            psVar5 = true_sel->sel_vector;
            uVar11 = 0;
            do {
              if (psVar4 == (sel_t *)0x0) {
                sVar9 = (int)uVar13 + (int)uVar11;
              }
              else {
                sVar9 = psVar4[uVar13 + uVar11];
              }
              if ((uVar3 >> (uVar11 & 0x3f) & 1) == 0) {
                uVar7 = 0;
              }
              else {
                uVar7 = (ulong)(*rdata < ldata[uVar13 + uVar11]);
              }
              psVar5[iVar6] = sVar9;
              iVar6 = iVar6 + uVar7;
              uVar11 = uVar11 + 1;
              uVar7 = uVar8;
            } while ((uVar13 - uVar8) + uVar11 != 0);
          }
        }
      }
      uVar12 = uVar12 + 1;
      uVar13 = uVar7;
    } while (uVar12 != uVar1 >> 6);
  }
  return iVar6;
}

Assistant:

static inline idx_t SelectFlatLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                         const SelectionVector *sel, idx_t count, ValidityMask &mask,
	                                         SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else if (true_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, false>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, false, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		}
	}